

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

JsonT<void> * __thiscall rlib::JsonT<void>::operator[](JsonT<void> *this,string *key)

{
  const_iterator cVar1;
  JsonT<void> *pJVar2;
  anon_union_48_6_6bd197de_for_JsonT<void>_3 *this_00;
  
  this_00 = (anon_union_48_6_6bd197de_for_JsonT<void>_3 *)m_emptyMap_abi_cxx11_;
  if (this->m_type == Map) {
    this_00 = &this->field_1;
  }
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
                  *)&this_00->m_string,key);
  pJVar2 = (JsonT<void> *)m_emptyJson;
  if (cVar1._M_node != (_Base_ptr)((long)this_00 + 8)) {
    pJVar2 = (JsonT<void> *)(cVar1._M_node + 2);
  }
  return pJVar2;
}

Assistant:

const U& get(typename std::enable_if<std::is_same<U, Map>::value >::type* = nullptr) const noexcept {
			return m_type == Type::Map ? m_map : m_emptyMap;
		}